

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lwlog-demo.c
# Opt level: O3

int main(void)

{
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  
  pFVar1 = _stderr;
  piVar2 = __errno_location();
  pcVar3 = "None";
  pcVar4 = "None";
  if (*piVar2 != 0) {
    pcVar4 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;31m[EMERG]   %s (%s:%d) \x1b[0mThis a emerge log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x13,pcVar4);
  pFVar1 = _stderr;
  pcVar4 = "None";
  if (*piVar2 != 0) {
    pcVar4 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;35m[ALERT]   %s (%s:%d) \x1b[0mThis a alert log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x14,pcVar4);
  pFVar1 = _stderr;
  pcVar4 = "None";
  if (*piVar2 != 0) {
    pcVar4 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[1;33m[CRIT]    %s (%s:%d) \x1b[0mThis a crit log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x15,pcVar4);
  pFVar1 = _stderr;
  pcVar4 = "None";
  if (*piVar2 != 0) {
    pcVar4 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;33m[ERR]     %s (%s:%d) \x1b[0mThis a err log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x16,pcVar4);
  pFVar1 = _stderr;
  pcVar4 = "None";
  if (*piVar2 != 0) {
    pcVar4 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;34m[WARNING] %s (%s:%d) \x1b[0mThis a warning log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x17,pcVar4);
  pFVar1 = _stderr;
  if (*piVar2 != 0) {
    pcVar3 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;36m[NOTICE]  %s (%s:%d) \x1b[0mThis a notice log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x18,pcVar3);
  fprintf(_stderr,"\x1b[0;32m[INFO]    %s (%s:%d) \x1b[0mThis a info log.\n","main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x19);
  fprintf(_stderr,"\x1b[0;37m[DEBUG]   %s (%s:%d) \x1b[0mThis a debug log.\n","main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x1a);
  return 0;
}

Assistant:

int main(void)
{
    lwlog_emerg("This a emerge log.");
    lwlog_alert("This a alert log.");
    lwlog_crit("This a crit log.");
    lwlog_err("This a err log.");
    lwlog_warning("This a warning log.");
    lwlog_notice("This a notice log.");
    lwlog_info("This a info log.");
    lwlog_debug("This a debug log.");

    return 0;
}